

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

void __thiscall tetgenmesh::makeindex2pointmap(tetgenmesh *this,point **idx2verlist)

{
  point *ppdVar1;
  point pdVar2;
  long lVar3;
  
  if (1 < this->b->verbose) {
    puts("  Constructing mapping from indices to points.");
  }
  lVar3 = this->points->items;
  ppdVar1 = (point *)operator_new__(-(ulong)(lVar3 + 1U >> 0x3d != 0) | lVar3 * 8 + 8U);
  *idx2verlist = ppdVar1;
  memorypool::traversalinit(this->points);
  pdVar2 = pointtraverse(this);
  lVar3 = (long)this->in->firstnumber << 3;
  while (pdVar2 != (point)0x0) {
    *(point *)((long)*idx2verlist + lVar3) = pdVar2;
    pdVar2 = pointtraverse(this);
    lVar3 = lVar3 + 8;
  }
  return;
}

Assistant:

void tetgenmesh::makeindex2pointmap(point*& idx2verlist)
{
  point pointloop;
  int idx;

  if (b->verbose > 1) {
    printf("  Constructing mapping from indices to points.\n");
  }

  idx2verlist = new point[points->items + 1];

  points->traversalinit();
  pointloop = pointtraverse();
  idx =  in->firstnumber;
  while (pointloop != (point) NULL) {
    idx2verlist[idx++] = pointloop;
    pointloop = pointtraverse();
  }
}